

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingScene::Rotate
          (FormattingScene *this,Float angle,Float ax,Float ay,Float az,FileLoc loc)

{
  float *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  float *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  char *in_stack_00000010;
  string local_38 [12];
  int in_stack_ffffffffffffffd4;
  FormattingScene *in_stack_ffffffffffffffd8;
  
  indent_abi_cxx11_(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  Printf<std::__cxx11::string,float&,float&,float&,float&>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,
             (float *)CONCAT44(in_XMM0_Da,in_XMM1_Da),(float *)CONCAT44(in_XMM2_Da,in_XMM3_Da));
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void FormattingScene::Rotate(Float angle, Float ax, Float ay, Float az, FileLoc loc) {
    Printf("%sRotate %f %f %f %f\n", indent(), angle, ax, ay, az);
}